

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall Instance::printTrainRoute(Instance *this)

{
  pointer ppEVar1;
  Edge *pEVar2;
  int iVar3;
  pointer pTVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer ppEVar7;
  bool bVar8;
  expr eVar9;
  model m;
  Train train;
  ast local_c8;
  pointer local_b8;
  pointer local_b0;
  ast local_a8;
  model local_98;
  ulong local_88;
  undefined8 uStack_80;
  ulong uStack_78;
  Edge *pEStack_70;
  vector<Stop,_std::allocator<Stop>_> local_68;
  vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
  local_50;
  
  z3::optimize::get_model((optimize *)&local_98);
  pTVar4 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pTVar4 != local_b8) {
    do {
      local_88._0_4_ = pTVar4->id;
      local_88._4_4_ = pTVar4->speed;
      uStack_80 = *(undefined8 *)&pTVar4->length;
      uStack_78 = *(ulong *)&pTVar4->start;
      pEStack_70 = (pTVar4->start).stopEdge;
      std::vector<Stop,_std::allocator<Stop>_>::vector(&local_68,&pTVar4->stops);
      local_b0 = pTVar4;
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::vector(&local_50,&pTVar4->paths);
      if (this->maxTimeSteps != 0) {
        uVar6 = 0;
        bVar8 = false;
        do {
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          if ((uVar6 < (uStack_78 & 0xffffffff)) || (bVar8)) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
            std::ostream::put('0');
            std::ostream::flush();
          }
          else {
            ppEVar1 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (ppEVar7 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                           _M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar1;
                ppEVar7 = ppEVar7 + 1) {
              pEVar2 = *ppEVar7;
              z3::ast_vector_tpl<z3::expr>::operator[]
                        ((ast_vector_tpl<z3::expr> *)&local_a8,
                         (int)(uVar6 << 4) +
                         (int)(this->occupiedVars).
                              super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_88 & 0xffffffff].
                              super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              eVar9 = z3::model::eval((model *)&local_c8,(expr *)&local_98,SUB81(&local_a8,0));
              iVar3 = Z3_get_bool_value((local_c8.super_object.m_ctx)->m_ctx,local_c8.m_ast,
                                        eVar9.super_ast.m_ast);
              z3::ast::~ast(&local_c8);
              z3::ast::~ast(&local_a8);
              if (iVar3 == 1) {
                bVar8 = pEVar2 == local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                                  super__Vector_impl_data._M_finish[-1].stopEdge;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pEVar2->to);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,pEVar2->from);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
              }
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
            std::ostream::put('0');
            std::ostream::flush();
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < this->maxTimeSteps);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      std::
      vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
      ::~vector(&local_50);
      if (local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pTVar4 = local_b0 + 1;
    } while (pTVar4 != local_b8);
  }
  z3::model::~model(&local_98);
  return;
}

Assistant:

void Instance::printTrainRoute() {
  model m = solver.get_model();
  for (Train train : trains) {
    bool reachedGoal = false;
    for (size_t time = 0; time < maxTimeSteps; time++) {
      std::cout << time << ": "; 
      if(time < train.start.arrivalTime || reachedGoal){
        std::cout << std::endl;
        continue;
      }
      for (Edge *edge : graph.edges) {
        if (m.eval(occupiedVars[train.id][time][edge->id], false)
                .bool_value() == Z3_TRUE) {
          reachedGoal = edge == train.stops.back().stopEdge;
          std::cout << "(" << edge->to << " " << edge->from << ") ";
        }
      }
      std::cout << std::endl;
    }
    std::cout << std::endl;
  }
}